

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framebuffer.hpp
# Opt level: O2

bool __thiscall qe::Framebuffer::valid(Framebuffer *this)

{
  GLenum GVar1;
  GLenum GVar2;
  ostream *poVar3;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  string sStack_38;
  
  bind(this,in_ESI,in_RDX,in_ECX);
  GVar1 = (*glad_glCheckFramebufferStatus)(0x8d40);
  if (GVar1 == 0x8cd5) {
    (*glad_glBindFramebuffer)(0x8d40,0);
  }
  else {
    GVar2 = (*glad_glCheckFramebufferStatus)(0x8d40);
    if (GVar2 == 0x8da8) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar3 = std::operator<<(poVar3,"FBO.valid: Incomplete Layer Targets");
      poVar3 = std::operator<<(poVar3," (");
      cut_abi_cxx11_(&sStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_38);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x56);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else if (GVar2 == 0x8cd7) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar3 = std::operator<<(poVar3,"FBO.valid: No Attachments");
      poVar3 = std::operator<<(poVar3," (");
      cut_abi_cxx11_(&sStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_38);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4d);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else if (GVar2 == 0x8cdc) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar3 = std::operator<<(poVar3,"FBO.valid: Invalid readBuffer");
      poVar3 = std::operator<<(poVar3," (");
      cut_abi_cxx11_(&sStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_38);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x50);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else if (GVar2 == 0x8d56) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar3 = std::operator<<(poVar3,"FBO.valid: Incomplete Multisample");
      poVar3 = std::operator<<(poVar3," (");
      cut_abi_cxx11_(&sStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_38);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x53);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      if (GVar2 != 0x8cd6) goto LAB_00161928;
      poVar3 = std::operator<<((ostream *)&std::cerr,"GERROR ");
      poVar3 = std::operator<<(poVar3,"FBO.valid: Incomplete Attachment");
      poVar3 = std::operator<<(poVar3," (");
      cut_abi_cxx11_(&sStack_38,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HTWGameDevelopment[P]2017WS_TeamOr8Bit/src/engine/framebuffer.hpp"
                    );
      poVar3 = std::operator<<(poVar3,(string *)&sStack_38);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x4a);
      poVar3 = std::operator<<(poVar3,")");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::__cxx11::string::~string((string *)&sStack_38);
  }
LAB_00161928:
  return GVar1 == 0x8cd5;
}

Assistant:

bool valid() {
            bind();
            if(glCheckFramebufferStatus(GL_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) {
                switch(glCheckFramebufferStatus(GL_FRAMEBUFFER)) {
                case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT:
                    GERR("FBO.valid: Incomplete Attachment");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT:
                    GERR("FBO.valid: No Attachments");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_READ_BUFFER:
                    GERR("FBO.valid: Invalid readBuffer");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_MULTISAMPLE:
                    GERR("FBO.valid: Incomplete Multisample");
                    break;
                case GL_FRAMEBUFFER_INCOMPLETE_LAYER_TARGETS:
                    GERR("FBO.valid: Incomplete Layer Targets");
                    break;
                }
                return false;
            }
            unbind();
            return true;
        }